

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
Graph::Graph(Graph *this,
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *param,int car_capacity,int num_car)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_type sVar6;
  ostream *poVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong *puVar11;
  reference pvVar12;
  reference pvVar13;
  int in_ECX;
  int in_EDX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  ulong uVar14;
  int j;
  int i_2;
  int i_1;
  int i;
  Graph *in_stack_ffffffffffffffa0;
  ulong *local_58;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  *in_RDI = &PTR__Graph_0011cd78;
  *(int *)(in_RDI + 1) = in_ECX;
  sVar6 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size(in_RSI);
  *(int *)((long)in_RDI + 0xc) = (int)sVar6;
  poVar7 = std::operator<<((ostream *)&std::cout,"constructor!");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&std::cout,"num_car:");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_ECX);
  poVar7 = std::operator<<(poVar7," car_capacity:");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,in_EDX);
  poVar7 = std::operator<<(poVar7," num_node(depot + customer):");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)((long)in_RDI + 0xc));
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)*(int *)((long)in_RDI + 0xc);
  uVar8 = SUB168(auVar2 * ZEXT816(0x20),0);
  if (SUB168(auVar2 * ZEXT816(0x20),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  in_RDI[3] = pvVar9;
  uVar8 = (ulong)in_ECX;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar10 = SUB168(auVar3 * ZEXT816(0x30),0);
  uVar14 = uVar10 + 8;
  if (SUB168(auVar3 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar10) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar11 = (ulong *)operator_new__(uVar14);
  *puVar11 = uVar8;
  puVar11 = puVar11 + 1;
  if (uVar8 != 0) {
    in_stack_ffffffffffffffa0 = (Graph *)(puVar11 + uVar8 * 6);
    local_58 = puVar11;
    do {
      Car::Car((Car *)0x114542);
      local_58 = local_58 + 6;
    } while ((Graph *)local_58 != in_stack_ffffffffffffffa0);
  }
  in_RDI[2] = puVar11;
  for (local_1c = 0; local_1c < *(int *)((long)in_RDI + 0xc); local_1c = local_1c + 1) {
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,0);
    *(value_type *)(in_RDI[3] + (long)local_1c * 0x20 + 8) = *pvVar13;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,1);
    *(value_type *)(in_RDI[3] + (long)local_1c * 0x20) = *pvVar13;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,2);
    *(value_type *)(in_RDI[3] + (long)local_1c * 0x20 + 4) = *pvVar13;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,3);
    *(value_type *)(in_RDI[3] + (long)local_1c * 0x20 + 0xc) = *pvVar13;
    *(undefined1 *)(in_RDI[3] + (long)local_1c * 0x20 + 0x10) = 0;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,4);
    *(value_type *)(in_RDI[3] + (long)local_1c * 0x20 + 0x14) = *pvVar13;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,5);
    *(value_type *)(in_RDI[3] + (long)local_1c * 0x20 + 0x18) = *pvVar13;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,5);
    iVar1 = *pvVar13;
    pvVar12 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](in_RSI,(long)local_1c);
    pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](pvVar12,4);
    *(int *)(in_RDI[3] + (long)local_1c * 0x20 + 0x1c) = (int)((double)(iVar1 - *pvVar13) * 0.2);
  }
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    *(int *)(in_RDI[2] + (long)local_20 * 0x30) = in_EDX;
    *(undefined4 *)(in_RDI[2] + (long)local_20 * 0x30 + 4) = 0;
    *(undefined4 *)(in_RDI[2] + (long)local_20 * 0x30 + 8) = 0;
    *(undefined4 *)(in_RDI[2] + (long)local_20 * 0x30 + 0xc) = 10;
    *(undefined4 *)(in_RDI[2] + (long)local_20 * 0x30 + 0x10) = 0;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)*(int *)((long)in_RDI + 0xc);
  uVar8 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar8);
  in_RDI[4] = pvVar9;
  for (local_24 = 0; local_24 < *(int *)((long)in_RDI + 0xc); local_24 = local_24 + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)*(int *)((long)in_RDI + 0xc);
    uVar8 = SUB168(auVar5 * ZEXT816(8),0);
    if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar8);
    *(void **)(in_RDI[4] + (long)local_24 * 8) = pvVar9;
    for (local_28 = 0; local_28 < *(int *)((long)in_RDI + 0xc); local_28 = local_28 + 1) {
      *(undefined8 *)(*(long *)(in_RDI[4] + (long)local_24 * 8) + (long)local_28 * 8) = 0;
    }
  }
  calc_node_distance(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

Graph::Graph(std::vector<std::vector<int> > param,
				int car_capacity, int num_car)
{
	this->num_car = num_car;
	this->num_node = param.size(); 

	std::cout << "constructor!" << std::endl;
	std::cout << "num_car:" << num_car << " car_capacity:" \
		<< car_capacity << " num_node(depot + customer):" << num_node << std::endl;

	nodes = new Node[num_node];
	cars = new Car[num_car];

	for(int i = 0; i < num_node; i++){
		nodes[i].idx = param[i][0];
		nodes[i].x = param[i][1];
		nodes[i].y = param[i][2];
		nodes[i].demand = param[i][3];
		nodes[i].visited = false;
		//time windows
		nodes[i].tw_open = param[i][4];
		nodes[i].tw_close = param[i][5];
		nodes[i].unload_time = (int)(0.2 * (param[i][5] - param[i][4]));
	}

	for(int i = 0; i < num_car; i++){
		cars[i].car_capacity = car_capacity;
		cars[i].now_load = 0;
		cars[i].now_idx = 0;
		//time windows
		cars[i].car_speed = 10;
		cars[i].now_time = 0;
	}

	distance_matrix = new double* [num_node]; 
	for(int i = 0; i < num_node; i++){
		distance_matrix[i] = new double [num_node];
		for(int j = 0; j < num_node; j++){
			distance_matrix[i][j] = 0;// initialization all elements in a row
		}
	}
	calc_node_distance();
}